

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

LispPTR COM_setfileinfo(LispPTR *args)

{
  char cVar1;
  int iVar2;
  int iVar3;
  LispPTR LVar4;
  uint uVar5;
  char *lf_cp;
  LispPTR *pLVar6;
  char *host_00;
  size_t sVar8;
  int *piVar9;
  long lVar10;
  DLword *pDVar11;
  char ver [16];
  timeval time [2];
  char name [255];
  stat sbuf;
  char host [255];
  char file [4096];
  char lfname [4101];
  char dir [4096];
  long lVar7;
  
  iVar2 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar2 != 0) {
    iVar3 = 100;
    goto LAB_0011b019;
  }
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);
  pLVar6 = NativeAligned4FromLAddr(*args);
  if (*(char *)((long)pLVar6 + 6) == 'D') {
    iVar2 = pLVar6[2] * 2 + 5;
LAB_0011b074:
    iVar3 = 200;
    if (0x1005 < iVar2) goto LAB_0011b019;
  }
  else {
    if (*(char *)((long)pLVar6 + 6) == 'C') {
      iVar2 = pLVar6[2] + 3;
      goto LAB_0011b074;
    }
    error("LispStringLength: Not a character array.\n");
  }
  pLVar6 = NativeAligned4FromLAddr(*args);
  LVar4 = 0x1000;
  if ((int)pLVar6[2] < 0x1000) {
    LVar4 = pLVar6[2];
  }
  lVar7 = (long)(int)LVar4;
  if (*(char *)((long)pLVar6 + 6) == 'D') {
    pDVar11 = Lisp_world + (ulong)(ushort)pLVar6[1] + (ulong)(*pLVar6 & 0xfffffff);
    for (lVar10 = 0; lVar7 != lVar10; lVar10 = lVar10 + 1) {
      lfname[lVar10] = *(char *)((ulong)pDVar11 ^ 2);
      pDVar11 = pDVar11 + 1;
    }
    lfname[lVar10] = '\0';
  }
  else if (*(char *)((long)pLVar6 + 6) == 'C') {
    uVar5 = *pLVar6;
    LVar4 = pLVar6[1];
    for (lVar10 = 0; lVar7 != lVar10; lVar10 = lVar10 + 1) {
      lfname[lVar10] =
           *(char *)((long)Lisp_world +
                     lVar10 + (ulong)(ushort)LVar4 + (ulong)(uVar5 & 0xfffffff) * 2 ^ 3);
    }
    lfname[lVar7] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  host_00 = host;
  separate_host(lfname,host_00);
  for (; cVar1 = *host_00, cVar1 != '\0'; host_00 = host_00 + 1) {
    if ((byte)(cVar1 + 0x9fU) < 0x1a) {
      *host_00 = cVar1 + -0x20;
    }
  }
  if (host._0_4_ == 0x4b5344) {
    unixpathname(lfname,file,1,0);
    iVar2 = unpack_filename(file,dir,name,ver,1);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = true_name(dir);
    if (iVar2 != -1) {
      return 0;
    }
    iVar2 = get_version_array(dir,name);
    if (iVar2 == 0) {
      return 0;
    }
    strcpy(file,name);
    if (ver[0] != '\0') {
      sVar8 = strlen(file);
      (file + sVar8)[0] = '.';
      (file + sVar8)[1] = '~';
      file[sVar8 + 2] = '\0';
      strcat(file,ver);
      sVar8 = strlen(file);
      (file + sVar8)[0] = '~';
      (file + sVar8)[1] = '\0';
    }
    iVar2 = get_old(dir,VA.files,file,name);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    iVar2 = bcmp(host,"UNIX",5);
    if (iVar2 != 0) {
      return 0;
    }
    unixpathname(lfname,file,0,0);
  }
  if (args[1] == 0xe0006) {
    uVar5 = args[2];
    if ((uVar5 & 0xfff0000) == 0xf0000) {
      uVar5 = uVar5 | 0xffff0000;
    }
    else if ((uVar5 & 0xfff0000) == 0xe0000) {
      uVar5 = uVar5 & 0xffff;
    }
    else {
      pLVar6 = NativeAligned4FromLAddr(uVar5);
      uVar5 = *pLVar6;
    }
    alarm(TIMEOUT_TIME);
    piVar9 = __errno_location();
    do {
      *piVar9 = 0;
      iVar2 = chmod(file,uVar5);
      if (iVar2 != -1) break;
      uVar5 = 0xffffffff;
    } while (*piVar9 == 4);
    alarm(0);
LAB_0011b44e:
    if (iVar2 == 0) {
      return 0x4c;
    }
  }
  else {
    if (args[1] != 0xe0002) {
      return 0;
    }
    alarm(TIMEOUT_TIME);
    piVar9 = __errno_location();
    do {
      *piVar9 = 0;
      iVar2 = stat(file,(stat *)&sbuf);
      if (iVar2 != -1) break;
    } while (*piVar9 == 4);
    alarm(0);
    if (iVar2 == 0) {
      uVar5 = args[2];
      if ((uVar5 & 0xfff0000) == 0xf0000) {
        uVar5 = uVar5 | 0xffff0000;
      }
      else if ((uVar5 & 0xfff0000) == 0xe0000) {
        uVar5 = uVar5 & 0xffff;
      }
      else {
        pLVar6 = NativeAligned4FromLAddr(uVar5);
        uVar5 = *pLVar6;
      }
      time[0].tv_sec = sbuf.st_atim.tv_sec;
      time[0].tv_usec = 0;
      time[1].tv_sec = (__time_t)(int)(uVar5 + 0xfe36b500);
      time[1].tv_usec = 0;
      alarm(TIMEOUT_TIME);
      do {
        *piVar9 = 0;
        iVar2 = utimes(file,(timeval *)time);
        if (iVar2 != -1) break;
      } while (*piVar9 == 4);
      alarm(0);
      goto LAB_0011b44e;
    }
  }
  iVar3 = *piVar9;
LAB_0011b019:
  *Lisp_errno = iVar3;
  return 0;
}

Assistant:

LispPTR COM_setfileinfo(LispPTR *args)
{
  int dskp, rval, date;
  char lfname[MAXPATHLEN + 5], file[MAXPATHLEN], host[MAXNAMLEN];
  char dir[MAXPATHLEN], name[MAXNAMLEN], ver[VERSIONLEN];
  struct stat sbuf;
#ifndef DOS
  struct timeval time[2];
#else
  char drive[1], rawname[MAXNAMLEN];
  int extlen;
#endif /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);

  LispStringLength(args[0], rval, dskp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = dskp ? rval + 4 + 1 : rval + 2 + 1;
  /* Add 5 for the host name field in Lisp format. */
  if (rval > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);

#ifdef DOS
  separate_host(lfname, host, drive);
#else
  separate_host(lfname, host);
#endif /* DOS */
  UPCASE(host);
  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

/*
 * Convert a Lisp file name to UNIX one.  If host is DSK, we also have to
 * convert a version field.
 */
#ifdef DOS
  unixpathname(lfname, file, dskp, 0, drive, &extlen, rawname);
#else  /* DOS */
  unixpathname(lfname, file, dskp, 0);
#endif /* DOS */

  /*
   * The file name which has been passed from Lisp is sometimes different
   * from the actual file name on DSK, even after the Lisp name is converted
   * to UNIX form with unixpathname.  The Lisp code for SETFILEINFO always
   * recognizes a file with old mode.  Thus, we recognize it again using
   * get_old routine.  It will let us know the "real accessible" name of
   * the file.
   */
  if (dskp) {
    if (unpack_filename(file, dir, name, ver, 1) == 0) return (NIL);
    if (true_name(dir) != -1) return (0);
    if (get_version_array(dir, name) == 0) return (NIL);
    ConcNameAndVersion(name, ver, file);
    if (get_old(dir, VA.files, file, name) == 0) return (NIL);
  }

  switch (args[1]) {
    case WDATE:
      TIMEOUT(rval = stat(file, &sbuf));
      if (rval != 0) {
        *Lisp_errno = errno;
        return (NIL);
      }
#ifndef DOS
      date = LispNumToCInt(args[2]);
      time[0].tv_sec = (long)sbuf.st_atime;
      time[0].tv_usec = 0L;
      time[1].tv_sec = (long)ToUnixTime(date);
      time[1].tv_usec = 0L;
      TIMEOUT(rval = utimes(file, time));
#endif /* DOS */
      if (rval != 0) {
        *Lisp_errno = errno;
        return (NIL);
      }
      return (ATOM_T);

    case PROTECTION:
      rval = LispNumToCInt(args[2]);
      TIMEOUT(rval = chmod(file, rval));
      if (rval != 0) {
        *Lisp_errno = errno;
        return (NIL);
      }
      return (ATOM_T);

    default: return (NIL);
  }
}